

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::str_cat_impl<char_const*,unsigned_long>(stringstream *ss,char **x,unsigned_long args)

{
  unsigned_long *in_RDX;
  stringstream *in_RSI;
  long in_RDI;
  
  std::operator<<((ostream *)(in_RDI + 0x10),*(char **)in_RSI);
  str_cat_impl<unsigned_long>(in_RSI,in_RDX);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}